

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlParseJson.c
# Opt level: O0

JL_STATUS VerifyHexString(char *String,size_t StringLength)

{
  ulong local_28;
  size_t i;
  JL_STATUS jlStatus;
  size_t StringLength_local;
  char *String_local;
  
  local_28 = 0;
  while( true ) {
    if (StringLength <= local_28) {
      return JL_STATUS_SUCCESS;
    }
    if ((((String[local_28] < '0') || ('9' < String[local_28])) &&
        ((String[local_28] < 'A' || ('F' < String[local_28])))) &&
       ((String[local_28] < 'a' || ('f' < String[local_28])))) break;
    local_28 = local_28 + 1;
  }
  return JL_STATUS_INVALID_DATA;
}

Assistant:

static
JL_STATUS
    VerifyHexString
    (
        char const*     String,
        size_t          StringLength
    )
{
    JL_STATUS jlStatus = JL_STATUS_SUCCESS;

    for( size_t i=0; i<StringLength; i++ )
    {
        if(     ( String[i] >= '0' && String[i] <= '9' )
            ||  ( String[i] >= 'A' && String[i] <= 'F' )
            ||  ( String[i] >= 'a' && String[i] <= 'f' ) )
        {
            // A valid hex char
        }
        else
        {
            jlStatus = JL_STATUS_INVALID_DATA;
            break;
        }
    }

    return jlStatus;
}